

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.h
# Opt level: O2

uint16_t __thiscall snestistics::EmulateRegisters::read_word_PC(EmulateRegisters *this)

{
  uint16_t uVar1;
  
  uVar1 = read_word(this,this->_PC,PROGRAM_COUNTER_RELATIVE);
  this->_PC = this->_PC + 2;
  return uVar1;
}

Assistant:

uint16_t read_word_PC() {
		uint16_t v = read_word(_PC, MemoryAccessType::PROGRAM_COUNTER_RELATIVE);
		_PC += 2;
		return v;
	}